

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void convert_all_containers(roaring_bitmap_t *r,uint8_t dst_type)

{
  uint8_t uVar1;
  array_container_t *paVar2;
  run_container_t *prVar3;
  long lVar4;
  
  if (0 < (r->high_low_container).size) {
    lVar4 = 0;
    do {
      uVar1 = (r->high_low_container).typecodes[lVar4];
      if (uVar1 == '\x03') {
        paVar2 = array_container_from_run
                           ((run_container_t *)(r->high_low_container).containers[lVar4]);
        run_container_free((run_container_t *)(r->high_low_container).containers[lVar4]);
LAB_00103a1f:
        (r->high_low_container).containers[lVar4] = paVar2;
        (r->high_low_container).typecodes[lVar4] = '\x02';
      }
      else if (uVar1 == '\x01') {
        paVar2 = array_container_from_bitset
                           ((bitset_container_t *)(r->high_low_container).containers[lVar4]);
        bitset_container_free((bitset_container_t *)(r->high_low_container).containers[lVar4]);
        goto LAB_00103a1f;
      }
      _assert_true((ulong)((r->high_low_container).typecodes[lVar4] == '\x02'),
                   "r->high_low_container.typecodes[i] == ARRAY_CONTAINER_TYPE",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                   ,0x17f);
      if (dst_type == '\x03') {
        prVar3 = run_container_from_array
                           ((array_container_t *)(r->high_low_container).containers[lVar4]);
LAB_00103a7a:
        array_container_free((array_container_t *)(r->high_low_container).containers[lVar4]);
        (r->high_low_container).containers[lVar4] = prVar3;
        (r->high_low_container).typecodes[lVar4] = dst_type;
      }
      else if (dst_type == '\x01') {
        prVar3 = (run_container_t *)
                 bitset_container_from_array
                           ((array_container_t *)(r->high_low_container).containers[lVar4]);
        goto LAB_00103a7a;
      }
      _assert_true((ulong)((r->high_low_container).typecodes[lVar4] == dst_type),
                   "r->high_low_container.typecodes[i] == dst_type",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                   ,0x191);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (r->high_low_container).size);
  }
  return;
}

Assistant:

void convert_all_containers(roaring_bitmap_t *r, uint8_t dst_type) {
    for (int32_t i = 0; i < r->high_low_container.size; i++) {
        // first step: convert src_type to ARRAY
        if (r->high_low_container.typecodes[i] == BITSET_CONTAINER_TYPE) {
            array_container_t *dst_container = array_container_from_bitset(
                CAST_bitset(r->high_low_container.containers[i]));
            bitset_container_free(
                CAST_bitset(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = ARRAY_CONTAINER_TYPE;
        } else if (r->high_low_container.typecodes[i] == RUN_CONTAINER_TYPE) {
            array_container_t *dst_container = array_container_from_run(
                CAST_run(r->high_low_container.containers[i]));
            run_container_free(CAST_run(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = ARRAY_CONTAINER_TYPE;
        }
        assert_true(r->high_low_container.typecodes[i] == ARRAY_CONTAINER_TYPE);

        // second step: convert ARRAY to dst_type
        if (dst_type == BITSET_CONTAINER_TYPE) {
            bitset_container_t *dst_container = bitset_container_from_array(
                CAST_array(r->high_low_container.containers[i]));
            array_container_free(
                CAST_array(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = BITSET_CONTAINER_TYPE;
        } else if (dst_type == RUN_CONTAINER_TYPE) {
            run_container_t *dst_container = run_container_from_array(
                CAST_array(r->high_low_container.containers[i]));
            array_container_free(
                CAST_array(r->high_low_container.containers[i]));
            r->high_low_container.containers[i] = dst_container;
            r->high_low_container.typecodes[i] = RUN_CONTAINER_TYPE;
        }
        assert_true(r->high_low_container.typecodes[i] == dst_type);
    }
}